

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_control_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b58b69::LFControlGetterTest_NullptrInput_Test::TestBody
          (LFControlGetterTest_NullptrInput_Test *this)

{
  bool bVar1;
  Type type;
  AssertHelper *this_00;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  aom_codec_enc_cfg_t cfg;
  aom_codec_ctx_t encoder;
  int *lf_level;
  aom_codec_ctx_t *in_stack_fffffffffffffb88;
  AssertHelper *in_stack_fffffffffffffb90;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffb98;
  aom_codec_iface_t *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  Type in_stack_fffffffffffffbbc;
  aom_codec_ctx_t *in_stack_fffffffffffffbc0;
  AssertionResult local_418 [2];
  Message *in_stack_fffffffffffffc08;
  AssertHelper *in_stack_fffffffffffffc10;
  AssertionResult local_3e0 [3];
  aom_codec_ctx_t local_48;
  undefined8 local_10;
  
  local_10 = 0;
  aom_codec_av1_cx();
  aom_codec_enc_config_default
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (uint)((ulong)in_stack_fffffffffffffb90 >> 0x20));
  aom_codec_av1_cx();
  aom_codec_enc_init_ver
            (in_stack_fffffffffffffbc0,
             (aom_codec_iface_t *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
             in_stack_fffffffffffffbb0,CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
             ,(int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
             (char *)in_stack_fffffffffffffba0,&in_stack_fffffffffffffb98->g_usage,
             (aom_codec_err_t *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbc0);
    in_stack_fffffffffffffba0 =
         (aom_codec_iface_t *)testing::AssertionResult::failure_message((AssertionResult *)0x86d04d)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
               (char *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
               (char *)in_stack_fffffffffffffba0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb90);
    testing::Message::~Message((Message *)0x86d0a1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x86d103);
  aom_codec_control(&local_48,0x96,local_10);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
             (char *)in_stack_fffffffffffffba0,&in_stack_fffffffffffffb98->g_usage,
             (aom_codec_err_t *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_418);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbc0);
    in_stack_fffffffffffffb98 =
         (aom_codec_enc_cfg_t *)
         testing::AssertionResult::failure_message((AssertionResult *)0x86d18a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
               (char *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
               (char *)in_stack_fffffffffffffba0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb90);
    testing::Message::~Message((Message *)0x86d1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x86d234);
  type = aom_codec_destroy(in_stack_fffffffffffffb88);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
             (char *)in_stack_fffffffffffffba0,&in_stack_fffffffffffffb98->g_usage,
             (aom_codec_err_t *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffbc0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbc0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x86d2a9)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbc0,type,(char *)in_stack_fffffffffffffbb0,
               in_stack_fffffffffffffbac,(char *)in_stack_fffffffffffffba0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x86d2f7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x86d350);
  return;
}

Assistant:

TEST(LFControlGetterTest, NullptrInput) {
  int *lf_level = nullptr;
  aom_codec_ctx_t encoder;
  aom_codec_enc_cfg_t cfg;
  aom_codec_enc_config_default(aom_codec_av1_cx(), &cfg, 1);
  EXPECT_EQ(aom_codec_enc_init(&encoder, aom_codec_av1_cx(), &cfg, 0),
            AOM_CODEC_OK);
  EXPECT_EQ(aom_codec_control(&encoder, AOME_GET_LOOPFILTER_LEVEL, lf_level),
            AOM_CODEC_INVALID_PARAM);
  EXPECT_EQ(aom_codec_destroy(&encoder), AOM_CODEC_OK);
}